

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

Mem_Flex_t * Mem_FlexStart(void)

{
  Mem_Flex_t *pMVar1;
  char **ppcVar2;
  
  pMVar1 = (Mem_Flex_t *)malloc(0x38);
  pMVar1->pEnd = (char *)0x0;
  pMVar1->nChunkSize = 0;
  pMVar1->nChunksAlloc = 0;
  *(undefined8 *)&pMVar1->nChunks = 0;
  pMVar1->pChunks = (char **)0x0;
  *(undefined8 *)pMVar1 = 0;
  pMVar1->pCurrent = (char *)0x0;
  pMVar1->nMemoryUsed = 0;
  pMVar1->nMemoryAlloc = 0;
  pMVar1->nChunkSize = 0x1000;
  pMVar1->nChunksAlloc = 0x40;
  pMVar1->nChunks = 0;
  ppcVar2 = (char **)malloc(0x200);
  pMVar1->pChunks = ppcVar2;
  pMVar1->nMemoryUsed = 0;
  pMVar1->nMemoryAlloc = 0;
  return pMVar1;
}

Assistant:

Mem_Flex_t * Mem_FlexStart()
{
    Mem_Flex_t * p;

    p = ABC_ALLOC( Mem_Flex_t, 1 );
    memset( p, 0, sizeof(Mem_Flex_t) );

    p->nEntriesUsed  = 0;
    p->pCurrent      = NULL;
    p->pEnd          = NULL;

    p->nChunkSize    = (1 << 12);
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}